

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

int CountNewlines(LPCOLESTR psz)

{
  int iVar1;
  OLECHAR *pOVar2;
  OLECHAR OVar3;
  
  OVar3 = *psz;
  if (OVar3 == L'\0') {
    return 0;
  }
  iVar1 = 0;
  do {
    pOVar2 = psz + 1;
    if (OVar3 == L'\n') {
LAB_00f11506:
      iVar1 = iVar1 + 1;
    }
    else if (OVar3 == L'\r') {
      if (psz[1] == L'\n') {
        pOVar2 = psz + 2;
      }
      goto LAB_00f11506;
    }
    OVar3 = *pOVar2;
    psz = pOVar2;
    if (OVar3 == L'\0') {
      return iVar1;
    }
  } while( true );
}

Assistant:

int CountNewlines(LPCOLESTR psz)
{
    int cln = 0;

    while (0 != *psz)
    {
        switch (*psz++)
        {
        case _u('\xD'):
            if (*psz == _u('\xA'))
            {
                ++psz;
            }
            // fall-through
        case _u('\xA'):
            cln++;
            break;
        }
    }

    return cln;
}